

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O0

void __thiscall
opts::BasicOption::BasicOption
          (BasicOption *this,char s_,string *l_,string *default_,string *type_,string *help_)

{
  string *in_RCX;
  string *in_RDX;
  undefined1 in_SIL;
  undefined8 *in_RDI;
  string *in_R8;
  string *in_R9;
  
  *in_RDI = &PTR__BasicOption_002f5a08;
  *(undefined1 *)(in_RDI + 1) = in_SIL;
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RDX);
  std::__cxx11::string::string((string *)(in_RDI + 6),in_RCX);
  std::__cxx11::string::string((string *)(in_RDI + 10),in_R8);
  std::__cxx11::string::string((string *)(in_RDI + 0xe),in_R9);
  return;
}

Assistant:

BasicOption(char        s_,
                                std::string l_,
                                std::string default_,
                                std::string type_,
                                std::string help_):
                        s(s_), l(l_), d(default_), t(type_), help(help_)                    {}